

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

void embree::avx2::SphereMiIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float fVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  Geometry *pGVar5;
  long lVar6;
  __int_type_conflict _Var7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  uint uVar20;
  uint uVar21;
  int iVar22;
  Scene *pSVar23;
  ulong uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 extraout_var [56];
  undefined4 uVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar46 [36];
  float fVar47;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [32];
  undefined1 auVar59 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar61 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [28];
  undefined1 auVar65 [64];
  undefined1 auVar66 [28];
  undefined1 auVar68 [64];
  undefined1 auVar69 [28];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [28];
  undefined1 auVar73 [64];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  SphereIntersectorHitM<8> hit;
  HitK<8> h;
  RTCFilterFunctionNArguments local_410;
  undefined1 local_3e0 [32];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_350 [16];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  uint local_1a0 [4];
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar45 [64];
  undefined1 auVar58 [64];
  undefined1 auVar60 [64];
  undefined1 auVar64 [32];
  undefined1 auVar67 [32];
  
  pSVar23 = context->scene;
  local_1a0[0] = sphere->sharedGeomID;
  pGVar5 = (pSVar23->geometries).items[local_1a0[0]].ptr;
  lVar6 = *(long *)&pGVar5->field_0x58;
  _Var7 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar25._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[4] * _Var7);
  auVar25._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[0] * _Var7);
  auVar33._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[5] * _Var7);
  auVar33._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[1] * _Var7);
  auVar42._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[6] * _Var7);
  auVar42._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[2] * _Var7);
  auVar44._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[7] * _Var7);
  auVar44._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[3] * _Var7);
  auVar59 = vunpcklps_avx(auVar25,auVar42);
  auVar35 = vunpckhps_avx(auVar25,auVar42);
  auVar42 = vunpcklps_avx(auVar33,auVar44);
  auVar25 = vunpckhps_avx(auVar33,auVar44);
  auVar74 = vunpcklps_avx(auVar59,auVar42);
  auVar59 = vunpckhps_avx(auVar59,auVar42);
  auVar42 = vunpcklps_avx(auVar35,auVar25);
  auVar33 = vunpckhps_avx(auVar35,auVar25);
  bVar4 = sphere->numPrimitives;
  auVar26._1_3_ = 0;
  auVar26[0] = bVar4;
  auVar26[4] = bVar4;
  auVar26._5_3_ = 0;
  auVar26[8] = bVar4;
  auVar26._9_3_ = 0;
  auVar26[0xc] = bVar4;
  auVar26._13_3_ = 0;
  auVar26[0x10] = bVar4;
  auVar26._17_3_ = 0;
  auVar26[0x14] = bVar4;
  auVar26._21_3_ = 0;
  auVar26[0x18] = bVar4;
  auVar26._25_3_ = 0;
  auVar26[0x1c] = bVar4;
  auVar26._29_3_ = 0;
  auVar26 = vpcmpgtd_avx2(auVar26,_DAT_0205a920);
  local_1a0[1] = local_1a0[0];
  local_1a0[2] = local_1a0[0];
  local_1a0[3] = local_1a0[0];
  uStack_190 = local_1a0[0];
  uStack_18c = local_1a0[0];
  uStack_188 = local_1a0[0];
  uStack_184 = local_1a0[0];
  uVar37 = *(undefined4 *)(ray + k * 4);
  auVar54._4_4_ = uVar37;
  auVar54._0_4_ = uVar37;
  auVar54._8_4_ = uVar37;
  auVar54._12_4_ = uVar37;
  auVar54._16_4_ = uVar37;
  auVar54._20_4_ = uVar37;
  auVar54._24_4_ = uVar37;
  auVar54._28_4_ = uVar37;
  auVar25 = vsubps_avx(auVar74,auVar54);
  uVar37 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar55._4_4_ = uVar37;
  auVar55._0_4_ = uVar37;
  auVar55._8_4_ = uVar37;
  auVar55._12_4_ = uVar37;
  auVar55._16_4_ = uVar37;
  auVar55._20_4_ = uVar37;
  auVar55._24_4_ = uVar37;
  auVar55._28_4_ = uVar37;
  auVar59 = vsubps_avx(auVar59,auVar55);
  uVar37 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar38._4_4_ = uVar37;
  auVar38._0_4_ = uVar37;
  auVar38._8_4_ = uVar37;
  auVar38._12_4_ = uVar37;
  auVar38._16_4_ = uVar37;
  auVar38._20_4_ = uVar37;
  auVar38._24_4_ = uVar37;
  auVar38._28_4_ = uVar37;
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  auVar64._4_4_ = fVar1;
  auVar64._0_4_ = fVar1;
  auVar64._8_4_ = fVar1;
  auVar64._12_4_ = fVar1;
  auVar64._16_4_ = fVar1;
  auVar64._20_4_ = fVar1;
  auVar64._24_4_ = fVar1;
  auVar64._28_4_ = fVar1;
  auVar65 = ZEXT3264(auVar64);
  fVar2 = *(float *)(ray + k * 4 + 0xa0);
  auVar67._4_4_ = fVar2;
  auVar67._0_4_ = fVar2;
  auVar67._8_4_ = fVar2;
  auVar67._12_4_ = fVar2;
  auVar67._16_4_ = fVar2;
  auVar67._20_4_ = fVar2;
  auVar67._24_4_ = fVar2;
  auVar67._28_4_ = fVar2;
  auVar68 = ZEXT3264(auVar67);
  fVar3 = *(float *)(ray + k * 4 + 0xc0);
  auVar70 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,CONCAT412(fVar3
                                                  ,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))))))));
  auVar42 = vsubps_avx(auVar42,auVar38);
  auVar43 = vfmadd231ps_fma(ZEXT432((uint)(fVar3 * fVar3)),auVar67,auVar67);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar64,auVar64);
  uVar37 = auVar43._0_4_;
  auVar48._4_4_ = uVar37;
  auVar48._0_4_ = uVar37;
  auVar48._8_4_ = uVar37;
  auVar48._12_4_ = uVar37;
  auVar48._16_4_ = uVar37;
  auVar48._20_4_ = uVar37;
  auVar48._24_4_ = uVar37;
  auVar48._28_4_ = uVar37;
  auVar35 = vrcpps_avx(auVar48);
  auVar39._8_4_ = 0x3f800000;
  auVar39._0_8_ = &DAT_3f8000003f800000;
  auVar39._12_4_ = 0x3f800000;
  auVar39._16_4_ = 0x3f800000;
  auVar39._20_4_ = 0x3f800000;
  auVar39._24_4_ = 0x3f800000;
  auVar39._28_4_ = 0x3f800000;
  auVar43 = vfnmadd231ps_fma(auVar39,auVar35,auVar48);
  auVar43 = vfmadd132ps_fma(ZEXT1632(auVar43),auVar35,auVar35);
  auVar74._4_4_ = fVar3 * auVar42._4_4_;
  auVar74._0_4_ = fVar3 * auVar42._0_4_;
  auVar74._8_4_ = fVar3 * auVar42._8_4_;
  auVar74._12_4_ = fVar3 * auVar42._12_4_;
  auVar74._16_4_ = fVar3 * auVar42._16_4_;
  auVar74._20_4_ = fVar3 * auVar42._20_4_;
  auVar74._24_4_ = fVar3 * auVar42._24_4_;
  auVar74._28_4_ = uVar37;
  auVar13 = vfmadd231ps_fma(auVar74,auVar59,auVar67);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar25,auVar64);
  fVar47 = auVar13._0_4_ * auVar43._0_4_;
  fVar51 = auVar13._4_4_ * auVar43._4_4_;
  fVar52 = auVar13._8_4_ * auVar43._8_4_;
  fVar53 = auVar13._12_4_ * auVar43._12_4_;
  auVar14._4_4_ = fVar1 * fVar51;
  auVar14._0_4_ = fVar1 * fVar47;
  auVar14._8_4_ = fVar1 * fVar52;
  auVar14._12_4_ = fVar1 * fVar53;
  auVar14._16_4_ = fVar1 * 0.0;
  auVar14._20_4_ = fVar1 * 0.0;
  auVar14._24_4_ = fVar1 * 0.0;
  auVar14._28_4_ = auVar35._28_4_;
  auVar61._0_4_ = fVar2 * fVar47;
  auVar61._4_4_ = fVar2 * fVar51;
  auVar61._8_4_ = fVar2 * fVar52;
  auVar61._12_4_ = fVar2 * fVar53;
  auVar61._16_4_ = fVar2 * 0.0;
  auVar61._20_4_ = fVar2 * 0.0;
  auVar61._28_36_ = in_ZMM8._28_36_;
  auVar61._24_4_ = fVar2 * 0.0;
  auVar62._0_4_ = fVar3 * fVar47;
  auVar62._4_4_ = fVar3 * fVar51;
  auVar62._8_4_ = fVar3 * fVar52;
  auVar62._12_4_ = fVar3 * fVar53;
  auVar62._16_4_ = fVar3 * 0.0;
  auVar62._20_4_ = fVar3 * 0.0;
  auVar62._28_36_ = in_ZMM9._28_36_;
  auVar62._24_4_ = fVar3 * 0.0;
  auVar74 = vsubps_avx(auVar25,auVar14);
  auVar71 = ZEXT3264(auVar74);
  auVar59 = vsubps_avx(auVar59,auVar61._0_32_);
  auVar61 = ZEXT3264(auVar59);
  auVar42 = vsubps_avx(auVar42,auVar62._0_32_);
  auVar62 = ZEXT3264(auVar42);
  auVar35._4_4_ = auVar42._4_4_ * auVar42._4_4_;
  auVar35._0_4_ = auVar42._0_4_ * auVar42._0_4_;
  auVar35._8_4_ = auVar42._8_4_ * auVar42._8_4_;
  auVar35._12_4_ = auVar42._12_4_ * auVar42._12_4_;
  auVar35._16_4_ = auVar42._16_4_ * auVar42._16_4_;
  auVar35._20_4_ = auVar42._20_4_ * auVar42._20_4_;
  auVar35._24_4_ = auVar42._24_4_ * auVar42._24_4_;
  auVar35._28_4_ = auVar25._28_4_;
  auVar13 = vfmadd231ps_fma(auVar35,auVar59,auVar59);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar74,auVar74);
  auVar15._4_4_ = auVar33._4_4_ * auVar33._4_4_;
  auVar15._0_4_ = auVar33._0_4_ * auVar33._0_4_;
  auVar15._8_4_ = auVar33._8_4_ * auVar33._8_4_;
  auVar15._12_4_ = auVar33._12_4_ * auVar33._12_4_;
  auVar15._16_4_ = auVar33._16_4_ * auVar33._16_4_;
  auVar15._20_4_ = auVar33._20_4_ * auVar33._20_4_;
  auVar15._24_4_ = auVar33._24_4_ * auVar33._24_4_;
  auVar15._28_4_ = auVar33._28_4_;
  auVar35 = vcmpps_avx(ZEXT1632(auVar13),auVar15,2);
  auVar25 = auVar26 & auVar35;
  if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0x7f,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar25 >> 0xbf,0) != '\0') ||
      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0') {
    auVar35 = vandps_avx(auVar35,auVar26);
    auVar12 = vpackssdw_avx(auVar35._0_16_,auVar35._16_16_);
    auVar35 = vsubps_avx(auVar15,ZEXT1632(auVar13));
    auVar16._4_4_ = auVar43._4_4_ * auVar35._4_4_;
    auVar16._0_4_ = auVar43._0_4_ * auVar35._0_4_;
    auVar16._8_4_ = auVar43._8_4_ * auVar35._8_4_;
    auVar16._12_4_ = auVar43._12_4_ * auVar35._12_4_;
    auVar16._16_4_ = auVar35._16_4_ * 0.0;
    auVar16._20_4_ = auVar35._20_4_ * 0.0;
    auVar16._24_4_ = auVar35._24_4_ * 0.0;
    auVar16._28_4_ = auVar35._28_4_;
    auVar33 = vsqrtps_avx(auVar16);
    auVar73 = ZEXT3264(auVar33);
    auVar26 = vsubps_avx(ZEXT1632(CONCAT412(fVar53,CONCAT48(fVar52,CONCAT44(fVar51,fVar47)))),
                         auVar33);
    auVar57._0_4_ = auVar33._0_4_ + fVar47;
    auVar57._4_4_ = auVar33._4_4_ + fVar51;
    auVar57._8_4_ = auVar33._8_4_ + fVar52;
    auVar57._12_4_ = auVar33._12_4_ + fVar53;
    auVar57._16_4_ = auVar33._16_4_ + 0.0;
    auVar57._20_4_ = auVar33._20_4_ + 0.0;
    auVar57._24_4_ = auVar33._24_4_ + 0.0;
    auVar57._28_4_ = auVar33._28_4_ + 0.0;
    auVar58 = ZEXT3264(auVar57);
    uVar37 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar40._4_4_ = uVar37;
    auVar40._0_4_ = uVar37;
    auVar40._8_4_ = uVar37;
    auVar40._12_4_ = uVar37;
    auVar40._16_4_ = uVar37;
    auVar40._20_4_ = uVar37;
    auVar40._24_4_ = uVar37;
    auVar40._28_4_ = uVar37;
    auVar35 = vcmpps_avx(auVar40,auVar26,2);
    uVar37 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar49._4_4_ = uVar37;
    auVar49._0_4_ = uVar37;
    auVar49._8_4_ = uVar37;
    auVar49._12_4_ = uVar37;
    auVar49._16_4_ = uVar37;
    auVar49._20_4_ = uVar37;
    auVar49._24_4_ = uVar37;
    auVar49._28_4_ = uVar37;
    auVar25 = vcmpps_avx(auVar26,auVar49,2);
    auVar35 = vandps_avx(auVar35,auVar25);
    auVar43 = vpackssdw_avx(auVar35._0_16_,auVar35._16_16_);
    auVar13 = vpand_avx(auVar43,auVar12);
    auVar56 = ZEXT1664(auVar13);
    auVar35 = vcmpps_avx(auVar40,auVar57,2);
    auVar25 = vcmpps_avx(auVar57,auVar49,2);
    auVar35 = vandps_avx(auVar35,auVar25);
    auVar43 = vpackssdw_avx(auVar35._0_16_,auVar35._16_16_);
    local_3b0 = vpand_avx(auVar43,auVar12);
    auVar43 = vpor_avx(local_3b0,auVar13);
    local_3e0 = vpmovsxwd_avx2(auVar43);
    if ((((((((local_3e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_3e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_3e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_3e0 >> 0x7f,0) != '\0') ||
          (local_3e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_3e0 >> 0xbf,0) != '\0') ||
        (local_3e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_3e0[0x1f] < '\0') {
      auVar25 = vpmovsxwd_avx2(auVar13);
      local_300 = vblendvps_avx(auVar57,auVar26,auVar25);
      auVar34._0_8_ = auVar33._0_8_ ^ 0x8000000080000000;
      auVar34._8_4_ = -auVar33._8_4_;
      auVar34._12_4_ = -auVar33._12_4_;
      auVar34._16_4_ = -auVar33._16_4_;
      auVar34._20_4_ = -auVar33._20_4_;
      auVar34._24_4_ = -auVar33._24_4_;
      auVar34._28_4_ = -auVar33._28_4_;
      auVar35 = vblendvps_avx(auVar33,auVar34,auVar25);
      fVar47 = auVar35._0_4_;
      fVar51 = auVar35._4_4_;
      auVar17._4_4_ = fVar1 * fVar51;
      auVar17._0_4_ = fVar1 * fVar47;
      fVar52 = auVar35._8_4_;
      auVar17._8_4_ = fVar1 * fVar52;
      fVar53 = auVar35._12_4_;
      auVar17._12_4_ = fVar1 * fVar53;
      fVar9 = auVar35._16_4_;
      auVar17._16_4_ = fVar1 * fVar9;
      fVar10 = auVar35._20_4_;
      auVar17._20_4_ = fVar1 * fVar10;
      fVar11 = auVar35._24_4_;
      auVar17._24_4_ = fVar1 * fVar11;
      auVar17._28_4_ = 0x80000000;
      auVar18._4_4_ = fVar2 * fVar51;
      auVar18._0_4_ = fVar2 * fVar47;
      auVar18._8_4_ = fVar2 * fVar52;
      auVar18._12_4_ = fVar2 * fVar53;
      auVar18._16_4_ = fVar2 * fVar9;
      auVar18._20_4_ = fVar2 * fVar10;
      auVar18._24_4_ = fVar2 * fVar11;
      auVar18._28_4_ = auVar25._28_4_;
      auVar19._4_4_ = fVar3 * fVar51;
      auVar19._0_4_ = fVar3 * fVar47;
      auVar19._8_4_ = fVar3 * fVar52;
      auVar19._12_4_ = fVar3 * fVar53;
      auVar19._16_4_ = fVar3 * fVar9;
      auVar19._20_4_ = fVar3 * fVar10;
      auVar19._24_4_ = fVar3 * fVar11;
      auVar19._28_4_ = auVar35._28_4_;
      local_2e0 = vsubps_avx(auVar17,auVar74);
      local_2c0 = vsubps_avx(auVar18,auVar59);
      local_2a0 = vsubps_avx(auVar19,auVar42);
      auVar50 = ZEXT3264(local_300);
      auVar35 = vpmovzxwd_avx2(auVar43);
      auVar35 = vpslld_avx2(auVar35,0x1f);
      auVar59._8_4_ = 0x7f800000;
      auVar59._0_8_ = 0x7f8000007f800000;
      auVar59._12_4_ = 0x7f800000;
      auVar59._16_4_ = 0x7f800000;
      auVar59._20_4_ = 0x7f800000;
      auVar59._24_4_ = 0x7f800000;
      auVar59._28_4_ = 0x7f800000;
      auVar60 = ZEXT3264(auVar59);
      auVar35 = vblendvps_avx(auVar59,local_300,auVar35);
      auVar25 = vshufps_avx(auVar35,auVar35,0xb1);
      auVar25 = vminps_avx(auVar35,auVar25);
      auVar59 = vshufpd_avx(auVar25,auVar25,5);
      auVar25 = vminps_avx(auVar25,auVar59);
      auVar42 = vpermpd_avx2(auVar25,0x4e);
      auVar25 = vminps_avx(auVar25,auVar42);
      auVar25 = vcmpps_avx(auVar35,auVar25,0);
      auVar59 = local_3e0 & auVar25;
      auVar35 = local_3e0;
      if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar59 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar59 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar59 >> 0x7f,0) != '\0') ||
            (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar59 >> 0xbf,0) != '\0') ||
          (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar59[0x1f] < '\0') {
        auVar35 = vandps_avx(auVar25,local_3e0);
      }
      uVar20 = vmovmskps_avx(auVar35);
      uVar21 = 0;
      for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
        uVar21 = uVar21 + 1;
      }
      iVar22 = 1 << ((uint)k & 0x1f);
      auVar27._4_4_ = iVar22;
      auVar27._0_4_ = iVar22;
      auVar27._8_4_ = iVar22;
      auVar27._12_4_ = iVar22;
      auVar27._16_4_ = iVar22;
      auVar27._20_4_ = iVar22;
      auVar27._24_4_ = iVar22;
      auVar27._28_4_ = iVar22;
      auVar25 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
      auVar75 = ZEXT3264(auVar25);
      auVar35 = vpand_avx2(auVar25,auVar27);
      local_320 = vpcmpeqd_avx2(auVar25,auVar35);
      do {
        auVar35 = auVar61._0_32_;
        local_410.hit = (RTCHitN *)&local_180;
        local_410.valid = (int *)local_3a0;
        auVar74 = auVar75._0_32_;
        auVar25 = auVar62._0_32_;
        auVar59 = auVar71._0_32_;
        auVar69 = auVar70._0_28_;
        auVar66 = auVar68._0_28_;
        auVar72 = auVar73._0_28_;
        auVar63 = auVar65._0_28_;
        auVar46 = ZEXT436(auVar42._28_4_);
        uVar24 = (ulong)uVar21;
        local_c0 = local_1a0[uVar24];
        pGVar5 = (pSVar23->geometries).items[local_c0].ptr;
        local_410.ray = (RTCRayN *)ray;
        if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_3e0 + uVar24 * 4) = 0;
          auVar46 = ZEXT436(auVar42._28_4_);
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar24 * 4);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_2e0 + uVar24 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_2c0 + uVar24 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_2a0 + uVar24 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x200) = 0;
            *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[uVar24];
            *(uint *)(ray + k * 4 + 0x240) = local_c0;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_017f4a98:
            uVar37 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar29._4_4_ = uVar37;
            auVar29._0_4_ = uVar37;
            auVar29._8_4_ = uVar37;
            auVar29._12_4_ = uVar37;
            auVar29._16_4_ = uVar37;
            auVar29._20_4_ = uVar37;
            auVar29._24_4_ = uVar37;
            auVar29._28_4_ = uVar37;
            auVar13 = vpand_avx(auVar56._0_16_,local_3b0);
            local_300 = auVar58._0_32_;
            auVar42 = vcmpps_avx(local_300,auVar29,2);
            auVar43 = vpackssdw_avx(auVar42._0_16_,auVar42._16_16_);
            auVar43 = vpand_avx(auVar43,auVar13);
            auVar42 = vpmovzxwd_avx2(auVar43);
            auVar42 = vpslld_avx2(auVar42,0x1f);
            if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar42 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar42 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar42 >> 0x7f,0) == '\0') &&
                  (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar42 >> 0xbf,0) == '\0') &&
                (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar42[0x1f]) {
              return;
            }
            local_3e0 = vpsrad_avx2(auVar42,0x1f);
            fVar1 = auVar72._0_4_;
            auVar68._0_4_ = auVar63._0_4_ * fVar1;
            fVar2 = auVar72._4_4_;
            auVar68._4_4_ = auVar63._4_4_ * fVar2;
            fVar3 = auVar72._8_4_;
            auVar68._8_4_ = auVar63._8_4_ * fVar3;
            fVar47 = auVar72._12_4_;
            auVar68._12_4_ = auVar63._12_4_ * fVar47;
            fVar51 = auVar72._16_4_;
            auVar68._16_4_ = auVar63._16_4_ * fVar51;
            fVar52 = auVar72._20_4_;
            auVar68._20_4_ = auVar63._20_4_ * fVar52;
            fVar53 = auVar72._24_4_;
            auVar68._24_4_ = auVar63._24_4_ * fVar53;
            auVar68._28_36_ = auVar46;
            auVar70._0_4_ = auVar66._0_4_ * fVar1;
            auVar70._4_4_ = auVar66._4_4_ * fVar2;
            auVar70._8_4_ = auVar66._8_4_ * fVar3;
            auVar70._12_4_ = auVar66._12_4_ * fVar47;
            auVar70._16_4_ = auVar66._16_4_ * fVar51;
            auVar70._20_4_ = auVar66._20_4_ * fVar52;
            auVar70._28_36_ = auVar50._28_36_;
            auVar70._24_4_ = auVar66._24_4_ * fVar53;
            auVar71._0_4_ = auVar69._0_4_ * fVar1;
            auVar71._4_4_ = auVar69._4_4_ * fVar2;
            auVar71._8_4_ = auVar69._8_4_ * fVar3;
            auVar71._12_4_ = auVar69._12_4_ * fVar47;
            auVar71._16_4_ = auVar69._16_4_ * fVar51;
            auVar71._20_4_ = auVar69._20_4_ * fVar52;
            auVar71._28_36_ = auVar56._28_36_;
            auVar71._24_4_ = auVar69._24_4_ * fVar53;
            local_2e0 = vsubps_avx(auVar68._0_32_,auVar59);
            local_2c0 = vsubps_avx(auVar70._0_32_,auVar35);
            local_2a0 = vsubps_avx(auVar71._0_32_,auVar25);
            pSVar23 = context->scene;
            auVar35 = vblendvps_avx(auVar60._0_32_,local_300,auVar42);
            auVar59 = vshufps_avx(auVar35,auVar35,0xb1);
            auVar59 = vminps_avx(auVar35,auVar59);
            auVar42 = vshufpd_avx(auVar59,auVar59,5);
            auVar59 = vminps_avx(auVar59,auVar42);
            auVar42 = vpermpd_avx2(auVar59,0x4e);
            auVar59 = vminps_avx(auVar59,auVar42);
            auVar35 = vcmpps_avx(auVar35,auVar59,0);
            auVar13 = vpackssdw_avx(auVar35._0_16_,auVar35._16_16_);
            auVar43 = vpand_avx(auVar13,auVar43);
            auVar35 = vpmovzxwd_avx2(auVar43);
            auVar35 = vpslld_avx2(auVar35,0x1f);
            if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar35 >> 0x7f,0) == '\0') &&
                  (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar35 >> 0xbf,0) == '\0') &&
                (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar35[0x1f]) {
              auVar35 = local_3e0;
            }
            uVar20 = vmovmskps_avx(auVar35);
            uVar21 = 0;
            for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
              uVar21 = uVar21 + 1;
            }
            iVar22 = 1 << ((uint)k & 0x1f);
            auVar30._4_4_ = iVar22;
            auVar30._0_4_ = iVar22;
            auVar30._8_4_ = iVar22;
            auVar30._12_4_ = iVar22;
            auVar30._16_4_ = iVar22;
            auVar30._20_4_ = iVar22;
            auVar30._24_4_ = iVar22;
            auVar30._28_4_ = iVar22;
            auVar35 = vpand_avx2(auVar74,auVar30);
            auVar35 = vpcmpeqd_avx2(auVar74,auVar35);
            auVar61 = ZEXT3264(auVar35);
            auVar62 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar35 = vpcmpeqd_avx2(auVar25,auVar25);
            auVar65 = ZEXT3264(auVar35);
            do {
              local_410.hit = (RTCHitN *)&local_180;
              local_410.valid = (int *)local_3a0;
              uVar24 = (ulong)uVar21;
              local_c0 = local_1a0[uVar24];
              pGVar5 = (pSVar23->geometries).items[local_c0].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_3e0 + uVar24 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_2e0 + uVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_2c0 + uVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_2a0 + uVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                  *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[uVar24];
                  *(uint *)(ray + k * 4 + 0x240) = local_c0;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  return;
                }
                local_e0._4_4_ = (sphere->primIDs).field_0.i[uVar24];
                local_180 = *(undefined4 *)(local_2e0 + uVar24 * 4);
                local_160._4_4_ = *(undefined4 *)(local_2c0 + uVar24 * 4);
                uVar37 = *(undefined4 *)(local_2a0 + uVar24 * 4);
                local_140._4_4_ = uVar37;
                local_140._0_4_ = uVar37;
                local_140._8_4_ = uVar37;
                local_140._12_4_ = uVar37;
                local_140._16_4_ = uVar37;
                local_140._20_4_ = uVar37;
                local_140._24_4_ = uVar37;
                local_140._28_4_ = uVar37;
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_160._0_4_ = local_160._4_4_;
                local_160._8_4_ = local_160._4_4_;
                local_160._12_4_ = local_160._4_4_;
                local_160._16_4_ = local_160._4_4_;
                local_160._20_4_ = local_160._4_4_;
                local_160._24_4_ = local_160._4_4_;
                local_160._28_4_ = local_160._4_4_;
                local_100 = auVar62._0_32_;
                local_120 = auVar62._0_32_;
                local_e0._0_4_ = local_e0._4_4_;
                local_e0._8_4_ = local_e0._4_4_;
                local_e0._12_4_ = local_e0._4_4_;
                local_e0._16_4_ = local_e0._4_4_;
                local_e0._20_4_ = local_e0._4_4_;
                local_e0._24_4_ = local_e0._4_4_;
                local_e0._28_4_ = local_e0._4_4_;
                uStack_bc = local_c0;
                uStack_b8 = local_c0;
                uStack_b4 = local_c0;
                uStack_b0 = local_c0;
                uStack_ac = local_c0;
                uStack_a8 = local_c0;
                uStack_a4 = local_c0;
                uStack_9c = context->user->instID[0];
                local_a0 = uStack_9c;
                uStack_98 = uStack_9c;
                uStack_94 = uStack_9c;
                uStack_90 = uStack_9c;
                uStack_8c = uStack_9c;
                uStack_88 = uStack_9c;
                uStack_84 = uStack_9c;
                uStack_7c = context->user->instPrimID[0];
                local_80 = uStack_7c;
                uStack_78 = uStack_7c;
                uStack_74 = uStack_7c;
                uStack_70 = uStack_7c;
                uStack_6c = uStack_7c;
                uStack_68 = uStack_7c;
                uStack_64 = uStack_7c;
                uVar37 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar24 * 4);
                local_3a0 = auVar61._0_32_;
                local_410.geometryUserPtr = pGVar5->userPtr;
                local_410.context = context->user;
                local_410.N = 8;
                local_410.ray = (RTCRayN *)ray;
                if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  local_380 = auVar58._0_32_;
                  local_3b0._0_8_ = pSVar23;
                  local_340._0_4_ = uVar37;
                  auVar35 = ZEXT1632(auVar65._0_16_);
                  local_320 = local_3a0;
                  (*pGVar5->intersectionFilterN)(&local_410);
                  auVar35 = vpcmpeqd_avx2(auVar35,auVar35);
                  auVar65 = ZEXT3264(auVar35);
                  auVar62 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar61 = ZEXT3264(local_320);
                  auVar60 = ZEXT3264(CONCAT428(0x7f800000,
                                               CONCAT424(0x7f800000,
                                                         CONCAT420(0x7f800000,
                                                                   CONCAT416(0x7f800000,
                                                                             CONCAT412(0x7f800000,
                                                                                       CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  auVar58 = ZEXT3264(local_380);
                  pSVar23 = (Scene *)local_3b0._0_8_;
                  uVar37 = local_340._0_4_;
                }
                auVar25 = vpcmpeqd_avx2(auVar62._0_32_,local_3a0);
                auVar35 = auVar65._0_32_ & ~auVar25;
                if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar35 >> 0x7f,0) == '\0') &&
                      (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar35 >> 0xbf,0) == '\0') &&
                    (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar35[0x1f]) {
                  auVar25 = auVar65._0_32_ ^ auVar25;
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    local_380 = auVar58._0_32_;
                    local_3b0._0_8_ = pSVar23;
                    local_320 = auVar61._0_32_;
                    local_340._0_4_ = uVar37;
                    auVar35 = ZEXT1632(auVar65._0_16_);
                    (*p_Var8)(&local_410);
                    auVar35 = vpcmpeqd_avx2(auVar35,auVar35);
                    auVar65 = ZEXT3264(auVar35);
                    auVar62 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar61 = ZEXT3264(local_320);
                    auVar60 = ZEXT3264(CONCAT428(0x7f800000,
                                                 CONCAT424(0x7f800000,
                                                           CONCAT420(0x7f800000,
                                                                     CONCAT416(0x7f800000,
                                                                               CONCAT412(0x7f800000,
                                                                                         CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    auVar58 = ZEXT3264(local_380);
                    pSVar23 = (Scene *)local_3b0._0_8_;
                    uVar37 = local_340._0_4_;
                  }
                  auVar59 = vpcmpeqd_avx2(auVar62._0_32_,local_3a0);
                  auVar25 = auVar65._0_32_ ^ auVar59;
                  auVar35 = auVar65._0_32_ & ~auVar59;
                  if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar35 >> 0x7f,0) != '\0') ||
                        (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar35 >> 0xbf,0) != '\0') ||
                      (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar35[0x1f] < '\0') {
                    auVar36._0_4_ = auVar65._0_4_ ^ auVar59._0_4_;
                    auVar36._4_4_ = auVar65._4_4_ ^ auVar59._4_4_;
                    auVar36._8_4_ = auVar65._8_4_ ^ auVar59._8_4_;
                    auVar36._12_4_ = auVar65._12_4_ ^ auVar59._12_4_;
                    auVar36._16_4_ = auVar65._16_4_ ^ auVar59._16_4_;
                    auVar36._20_4_ = auVar65._20_4_ ^ auVar59._20_4_;
                    auVar36._24_4_ = auVar65._24_4_ ^ auVar59._24_4_;
                    auVar36._28_4_ = auVar65._28_4_ ^ auVar59._28_4_;
                    auVar35 = vmaskmovps_avx(auVar36,*(undefined1 (*) [32])local_410.hit);
                    *(undefined1 (*) [32])(local_410.ray + 0x180) = auVar35;
                    auVar35 = vmaskmovps_avx(auVar36,*(undefined1 (*) [32])(local_410.hit + 0x20));
                    *(undefined1 (*) [32])(local_410.ray + 0x1a0) = auVar35;
                    auVar35 = vmaskmovps_avx(auVar36,*(undefined1 (*) [32])(local_410.hit + 0x40));
                    *(undefined1 (*) [32])(local_410.ray + 0x1c0) = auVar35;
                    auVar35 = vmaskmovps_avx(auVar36,*(undefined1 (*) [32])(local_410.hit + 0x60));
                    *(undefined1 (*) [32])(local_410.ray + 0x1e0) = auVar35;
                    auVar35 = vmaskmovps_avx(auVar36,*(undefined1 (*) [32])(local_410.hit + 0x80));
                    *(undefined1 (*) [32])(local_410.ray + 0x200) = auVar35;
                    auVar35 = vpmaskmovd_avx2(auVar36,*(undefined1 (*) [32])(local_410.hit + 0xa0));
                    *(undefined1 (*) [32])(local_410.ray + 0x220) = auVar35;
                    auVar35 = vpmaskmovd_avx2(auVar36,*(undefined1 (*) [32])(local_410.hit + 0xc0));
                    *(undefined1 (*) [32])(local_410.ray + 0x240) = auVar35;
                    auVar35 = vpmaskmovd_avx2(auVar36,*(undefined1 (*) [32])(local_410.hit + 0xe0));
                    *(undefined1 (*) [32])(local_410.ray + 0x260) = auVar35;
                    auVar35 = vpmaskmovd_avx2(auVar36,*(undefined1 (*) [32])(local_410.hit + 0x100))
                    ;
                    *(undefined1 (*) [32])(local_410.ray + 0x280) = auVar35;
                  }
                }
                if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar25 >> 0x7f,0) == '\0') &&
                      (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar25 >> 0xbf,0) == '\0') &&
                    (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar25[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar37;
                }
                *(undefined4 *)(local_3e0 + uVar24 * 4) = 0;
                uVar37 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar31._4_4_ = uVar37;
                auVar31._0_4_ = uVar37;
                auVar31._8_4_ = uVar37;
                auVar31._12_4_ = uVar37;
                auVar31._16_4_ = uVar37;
                auVar31._20_4_ = uVar37;
                auVar31._24_4_ = uVar37;
                auVar31._28_4_ = uVar37;
                auVar35 = vcmpps_avx(auVar58._0_32_,auVar31,2);
                local_3e0 = vandps_avx(auVar35,local_3e0);
              }
              if ((((((((local_3e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_3e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_3e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_3e0 >> 0x7f,0) == '\0') &&
                    (local_3e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_3e0 >> 0xbf,0) == '\0') &&
                  (local_3e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_3e0[0x1f]) {
                return;
              }
              auVar35 = vblendvps_avx(auVar60._0_32_,auVar58._0_32_,local_3e0);
              auVar25 = vshufps_avx(auVar35,auVar35,0xb1);
              auVar25 = vminps_avx(auVar35,auVar25);
              auVar59 = vshufpd_avx(auVar25,auVar25,5);
              auVar25 = vminps_avx(auVar25,auVar59);
              auVar59 = vpermpd_avx2(auVar25,0x4e);
              auVar25 = vminps_avx(auVar25,auVar59);
              auVar25 = vcmpps_avx(auVar35,auVar25,0);
              auVar59 = local_3e0 & auVar25;
              auVar35 = local_3e0;
              if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar59 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar59 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar59 >> 0x7f,0) != '\0') ||
                    (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar59 >> 0xbf,0) != '\0') ||
                  (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar59[0x1f] < '\0') {
                auVar35 = vandps_avx(auVar25,local_3e0);
              }
              uVar20 = vmovmskps_avx(auVar35);
              uVar21 = 0;
              for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
                uVar21 = uVar21 + 1;
              }
            } while( true );
          }
          local_340 = auVar50._0_32_;
          uVar21 = (sphere->primIDs).field_0.i[uVar24];
          local_e0._4_4_ = uVar21;
          local_e0._0_4_ = uVar21;
          local_e0._8_4_ = uVar21;
          local_e0._12_4_ = uVar21;
          local_e0._16_4_ = uVar21;
          local_e0._20_4_ = uVar21;
          local_e0._24_4_ = uVar21;
          local_e0._28_4_ = uVar21;
          local_180 = *(undefined4 *)(local_2e0 + uVar24 * 4);
          uVar37 = *(undefined4 *)(local_2c0 + uVar24 * 4);
          auVar43._4_4_ = uVar37;
          auVar43._0_4_ = uVar37;
          auVar43._8_4_ = uVar37;
          auVar43._12_4_ = uVar37;
          local_160._16_4_ = uVar37;
          local_160._0_16_ = auVar43;
          local_160._20_4_ = uVar37;
          local_160._24_4_ = uVar37;
          local_160._28_4_ = uVar37;
          auVar45 = ZEXT3264(local_160);
          local_140._4_4_ = *(undefined4 *)(local_2a0 + uVar24 * 4);
          uStack_17c = local_180;
          uStack_178 = local_180;
          uStack_174 = local_180;
          uStack_170 = local_180;
          uStack_16c = local_180;
          uStack_168 = local_180;
          uStack_164 = local_180;
          local_140._0_4_ = local_140._4_4_;
          local_140._8_4_ = local_140._4_4_;
          local_140._12_4_ = local_140._4_4_;
          local_140._16_4_ = local_140._4_4_;
          local_140._20_4_ = local_140._4_4_;
          local_140._24_4_ = local_140._4_4_;
          local_140._28_4_ = local_140._4_4_;
          auVar41 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          local_100 = auVar41;
          local_120 = auVar41;
          uStack_bc = local_c0;
          uStack_b8 = local_c0;
          uStack_b4 = local_c0;
          uStack_b0 = local_c0;
          uStack_ac = local_c0;
          uStack_a8 = local_c0;
          uStack_a4 = local_c0;
          auVar42 = vpcmpeqd_avx2(local_e0,local_e0);
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          uVar37 = *(undefined4 *)(ray + k * 4 + 0x100);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar24 * 4);
          local_3a0 = local_320;
          local_410.geometryUserPtr = pGVar5->userPtr;
          local_410.context = context->user;
          local_410.N = 8;
          if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_380 = auVar58._0_32_;
            local_1c0 = auVar65._0_32_;
            local_1e0 = auVar68._0_32_;
            local_200 = auVar70._0_32_;
            local_350 = auVar56._0_16_;
            auVar41._0_24_ = ZEXT1624((undefined1  [16])0x0);
            auVar41._24_8_ = 0;
            auVar45 = ZEXT1664(auVar43);
            local_280 = auVar73._0_32_;
            local_260 = auVar25;
            local_240 = auVar35;
            local_220 = auVar59;
            (*pGVar5->intersectionFilterN)(&local_410);
            auVar65._8_56_ = extraout_var;
            auVar65._0_8_ = extraout_XMM1_Qa;
            auVar42 = vpcmpeqd_avx2(auVar65._0_32_,auVar65._0_32_);
            auVar35 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
            auVar75 = ZEXT3264(auVar35);
            auVar56 = ZEXT1664(local_350);
            auVar73 = ZEXT3264(local_280);
            auVar62 = ZEXT3264(local_260);
            auVar61 = ZEXT3264(local_240);
            auVar71 = ZEXT3264(local_220);
            auVar70 = ZEXT3264(local_200);
            auVar68 = ZEXT3264(local_1e0);
            auVar65 = ZEXT3264(local_1c0);
            auVar60 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar58 = ZEXT3264(local_380);
          }
          auVar59 = auVar45._0_32_;
          auVar25 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),local_3a0);
          auVar35 = auVar42 & ~auVar25;
          auVar50 = ZEXT3264(local_340);
          if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar35 >> 0x7f,0) == '\0') &&
                (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar35 >> 0xbf,0) == '\0') &&
              (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar35[0x1f]) {
            auVar32 = ZEXT3264(auVar25 ^ auVar42);
          }
          else {
            p_Var8 = context->args->filter;
            if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              local_380 = auVar58._0_32_;
              local_1c0 = auVar65._0_32_;
              local_1e0 = auVar68._0_32_;
              local_200 = auVar70._0_32_;
              local_220 = auVar71._0_32_;
              local_240 = auVar61._0_32_;
              local_260 = auVar62._0_32_;
              local_280 = auVar73._0_32_;
              local_350 = auVar56._0_16_;
              auVar41 = ZEXT1632(auVar41._0_16_);
              auVar59 = ZEXT1632(auVar45._0_16_);
              (*p_Var8)(&local_410);
              auVar50 = ZEXT3264(local_340);
              auVar35 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
              auVar75 = ZEXT3264(auVar35);
              auVar56 = ZEXT1664(local_350);
              auVar73 = ZEXT3264(local_280);
              auVar62 = ZEXT3264(local_260);
              auVar61 = ZEXT3264(local_240);
              auVar71 = ZEXT3264(local_220);
              auVar70 = ZEXT3264(local_200);
              auVar68 = ZEXT3264(local_1e0);
              auVar65 = ZEXT3264(local_1c0);
              auVar60 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar58 = ZEXT3264(local_380);
            }
            auVar25 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),local_3a0);
            auVar35 = vpcmpeqd_avx2(auVar59,auVar59);
            auVar45 = ZEXT3264(auVar35);
            auVar32 = ZEXT3264(auVar25 ^ auVar35);
            auVar59 = vpcmpeqd_avx2(auVar41,auVar41);
            auVar35 = auVar35 & ~auVar25;
            if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar35 >> 0x7f,0) != '\0') ||
                  (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar35 >> 0xbf,0) != '\0') ||
                (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar35[0x1f] < '\0') {
              auVar25 = auVar25 ^ auVar59;
              auVar35 = vmaskmovps_avx(auVar25,*(undefined1 (*) [32])local_410.hit);
              *(undefined1 (*) [32])(local_410.ray + 0x180) = auVar35;
              auVar35 = vmaskmovps_avx(auVar25,*(undefined1 (*) [32])(local_410.hit + 0x20));
              *(undefined1 (*) [32])(local_410.ray + 0x1a0) = auVar35;
              auVar35 = vmaskmovps_avx(auVar25,*(undefined1 (*) [32])(local_410.hit + 0x40));
              *(undefined1 (*) [32])(local_410.ray + 0x1c0) = auVar35;
              auVar35 = vmaskmovps_avx(auVar25,*(undefined1 (*) [32])(local_410.hit + 0x60));
              *(undefined1 (*) [32])(local_410.ray + 0x1e0) = auVar35;
              auVar35 = vmaskmovps_avx(auVar25,*(undefined1 (*) [32])(local_410.hit + 0x80));
              *(undefined1 (*) [32])(local_410.ray + 0x200) = auVar35;
              auVar35 = vpmaskmovd_avx2(auVar25,*(undefined1 (*) [32])(local_410.hit + 0xa0));
              *(undefined1 (*) [32])(local_410.ray + 0x220) = auVar35;
              auVar35 = vpmaskmovd_avx2(auVar25,*(undefined1 (*) [32])(local_410.hit + 0xc0));
              *(undefined1 (*) [32])(local_410.ray + 0x240) = auVar35;
              auVar35 = vpmaskmovd_avx2(auVar25,*(undefined1 (*) [32])(local_410.hit + 0xe0));
              *(undefined1 (*) [32])(local_410.ray + 0x260) = auVar35;
              auVar35 = vpmaskmovd_avx2(auVar25,*(undefined1 (*) [32])(local_410.hit + 0x100));
              *(undefined1 (*) [32])(local_410.ray + 0x280) = auVar35;
            }
          }
          auVar35 = auVar32._0_32_;
          if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar35 >> 0x7f,0) == '\0') &&
                (auVar32 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar35 >> 0xbf,0) == '\0') &&
              (auVar32 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar32[0x1f]) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar37;
          }
          *(undefined4 *)(local_3e0 + uVar24 * 4) = 0;
          uVar37 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar28._4_4_ = uVar37;
          auVar28._0_4_ = uVar37;
          auVar28._8_4_ = uVar37;
          auVar28._12_4_ = uVar37;
          auVar28._16_4_ = uVar37;
          auVar28._20_4_ = uVar37;
          auVar28._24_4_ = uVar37;
          auVar28._28_4_ = uVar37;
          auVar35 = vcmpps_avx(auVar50._0_32_,auVar28,2);
          local_3e0 = vandps_avx(auVar35,local_3e0);
          auVar46 = auVar45._28_36_;
        }
        auVar35 = auVar61._0_32_;
        auVar74 = auVar75._0_32_;
        auVar25 = auVar62._0_32_;
        auVar59 = auVar71._0_32_;
        auVar69 = auVar70._0_28_;
        auVar66 = auVar68._0_28_;
        auVar72 = auVar73._0_28_;
        auVar63 = auVar65._0_28_;
        if ((((((((local_3e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_3e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_3e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_3e0 >> 0x7f,0) == '\0') &&
              (local_3e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_3e0 >> 0xbf,0) == '\0') &&
            (local_3e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_3e0[0x1f]) goto LAB_017f4a98;
        auVar35 = vblendvps_avx(auVar60._0_32_,auVar50._0_32_,local_3e0);
        auVar25 = vshufps_avx(auVar35,auVar35,0xb1);
        auVar25 = vminps_avx(auVar35,auVar25);
        auVar59 = vshufpd_avx(auVar25,auVar25,5);
        auVar25 = vminps_avx(auVar25,auVar59);
        auVar42 = vpermpd_avx2(auVar25,0x4e);
        auVar25 = vminps_avx(auVar25,auVar42);
        auVar25 = vcmpps_avx(auVar35,auVar25,0);
        auVar59 = local_3e0 & auVar25;
        auVar35 = local_3e0;
        if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar59 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar59 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar59 >> 0x7f,0) != '\0') ||
              (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar59 >> 0xbf,0) != '\0') ||
            (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar59[0x1f] < '\0') {
          auVar35 = vandps_avx(auVar25,local_3e0);
        }
        uVar20 = vmovmskps_avx(auVar35);
        uVar21 = 0;
        for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
          uVar21 = uVar21 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }